

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

int __thiscall ev3dev::sensor::decimals(sensor *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"decimals",&local_31);
  iVar1 = device::get_attr_int(&this->super_device,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int decimals() const { return get_attr_int("decimals"); }